

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetObjectRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *this,Member *members,SizeType count,
            MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Ch **ppCVar1;
  void *__dest;
  
  (this->data_).f.flags = 3;
  if (count == 0) {
    ppCVar1 = &(this->data_).s.str;
    *ppCVar1 = (Ch *)((ulong)*ppCVar1 & 0xffff000000000000);
  }
  else {
    __dest = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,(ulong)count << 5);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).s.str & 0xffff000000000000 | (ulong)__dest);
    memcpy(__dest,members,(ulong)count << 5);
  }
  (this->data_).s.hashcode = count;
  (this->data_).s.length = count;
  return;
}

Assistant:

void SetObjectRaw(Member* members, SizeType count, Allocator& allocator) {
        data_.f.flags = kObjectFlag;
        if (count) {
            Member* m = static_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
            SetMembersPointer(m);
            std::memcpy(static_cast<void*>(m), members, count * sizeof(Member));
        }
        else
            SetMembersPointer(0);
        data_.o.size = data_.o.capacity = count;
    }